

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<char_*,_char>_>::write
          (arg_formatter_base<fmt::v5::output_range<char_*,_char>_> *this,int __fd,void *__buf,
          size_t __n)

{
  iterator __dest;
  ssize_t extraout_RAX;
  void *pvVar1;
  char **it;
  char *__src;
  ptrdiff_t _Num;
  ulong __n_00;
  basic_string_view<char> s;
  
  __src = "false";
  if (__fd != 0) {
    __src = "true";
  }
  __n_00 = (ulong)(uint)__fd ^ 5;
  if (this->specs_ != (format_specs *)0x0) {
    s.size_ = __n_00;
    s.data_ = __src;
    basic_writer<fmt::v5::output_range<char_*,_char>_>::write<char>(&this->writer_,s,this->specs_);
    return extraout_RAX;
  }
  __dest = (this->writer_).out_;
  pvVar1 = memcpy(__dest,__src,__n_00);
  (this->writer_).out_ = __dest + __n_00;
  return (ssize_t)pvVar1;
}

Assistant:

void write(bool value) {
    string_view sv(value ? "true" : "false");
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }